

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall FPolyObj::UnLinkPolyobj(FPolyObj *this)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int index;
  int j;
  int i;
  polyblock_t *link;
  FPolyObj *this_local;
  
  for (local_20 = this->bbox[1]; local_20 <= this->bbox[0]; local_20 = local_20 + 1) {
    iVar1 = local_20 * bmapwidth;
    for (index = this->bbox[2]; index <= this->bbox[3]; index = index + 1) {
      if ((((-1 < index) && (index < bmapwidth)) && (-1 < local_20)) && (local_20 < bmapheight)) {
        _j = PolyBlockMap[iVar1 + index];
        while( true ) {
          bVar2 = false;
          if (_j != (polyblock_t *)0x0) {
            bVar2 = _j->polyobj != this;
          }
          if (!bVar2) break;
          _j = _j->next;
        }
        if (_j != (polyblock_t *)0x0) {
          _j->polyobj = (FPolyObj *)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void FPolyObj::UnLinkPolyobj ()
{
	polyblock_t *link;
	int i, j;
	int index;

	// remove the polyobj from each blockmap section
	for(j = bbox[BOXBOTTOM]; j <= bbox[BOXTOP]; j++)
	{
		index = j*bmapwidth;
		for(i = bbox[BOXLEFT]; i <= bbox[BOXRIGHT]; i++)
		{
			if(i >= 0 && i < bmapwidth && j >= 0 && j < bmapheight)
			{
				link = PolyBlockMap[index+i];
				while(link != NULL && link->polyobj != this)
				{
					link = link->next;
				}
				if(link == NULL)
				{ // polyobj not located in the link cell
					continue;
				}
				link->polyobj = NULL;
			}
		}
	}
}